

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::keyReleaseEvent(QTextEdit *this,QKeyEvent *e)

{
  bool bVar1;
  QTextEditPrivate *pQVar2;
  QWidgetPrivate *in_RSI;
  QTextEdit *in_RDI;
  QTextEditPrivate *d;
  undefined1 clickCausedFocus;
  
  pQVar2 = d_func((QTextEdit *)0x6d3661);
  clickCausedFocus = (undefined1)((ulong)pQVar2 >> 0x38);
  bVar1 = isReadOnly(in_RDI);
  if (!bVar1) {
    QWidgetPrivate::handleSoftwareInputPanel(in_RSI,(bool)clickCausedFocus);
  }
  QEvent::ignore((QEvent *)in_RSI);
  return;
}

Assistant:

void QTextEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QTextEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        if (!e->isAutoRepeat() && e->key() == Qt::Key_Back
            && d->deleteAllTimer.isActive()) {
            d->deleteAllTimer.stop();
            QTextCursor cursor = d->control->textCursor();
            QTextBlockFormat blockFmt = cursor.blockFormat();

            QTextList *list = cursor.currentList();
            if (list && cursor.atBlockStart()) {
                list->remove(cursor.block());
            } else if (cursor.atBlockStart() && blockFmt.indent() > 0) {
                blockFmt.setIndent(blockFmt.indent() - 1);
                cursor.setBlockFormat(blockFmt);
            } else {
                cursor.deletePreviousChar();
            }
            setTextCursor(cursor);
            e->accept();
            return;
        }
    }
#endif
    e->ignore();
}